

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrollarea.cpp
# Opt level: O0

void __thiscall QtMWidgets::ScrollAreaPrivate::updateScrolledSize(ScrollAreaPrivate *this)

{
  int iVar1;
  AbstractScrollArea *this_00;
  QWidget *pQVar2;
  long lVar3;
  int *piVar4;
  byte local_79;
  QSize local_68;
  QSize local_60;
  QSize local_58;
  int local_50;
  QSize local_4c;
  int local_44;
  QSize QStack_40;
  int h;
  QSize p_hfw;
  QSize local_30;
  QSize max;
  QSize min;
  QSize p;
  ScrollArea *q;
  ScrollAreaPrivate *this_local;
  
  this_00 = &q_func(this)->super_AbstractScrollArea;
  pQVar2 = QPointer::operator_cast_to_QWidget_((QPointer *)&this->widget);
  if (pQVar2 != (QWidget *)0x0) {
    min = QWidget::size((this->super_AbstractScrollAreaPrivate).viewport);
    pQVar2 = QPointer::operator_cast_to_QWidget_((QPointer *)&this->widget);
    max = qSmartMinSize(pQVar2);
    pQVar2 = QPointer::operator_cast_to_QWidget_((QPointer *)&this->widget);
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)&p_hfw.ht);
    local_30 = qSmartMaxSize(pQVar2,(Alignment)p_hfw.ht);
    if ((this->resizable & 1U) != 0) {
      QPointer<QWidget>::operator->(&this->widget);
      lVar3 = QWidget::layout();
      if (lVar3 == 0) {
        QPointer<QWidget>::operator->(&this->widget);
        p_hfw.wd = QWidget::sizePolicy();
        local_79 = QSizePolicy::hasHeightForWidth((QSizePolicy *)&p_hfw);
      }
      else {
        QPointer<QWidget>::operator->(&this->widget);
        lVar3 = QWidget::layout();
        local_79 = (**(code **)(*(long *)(lVar3 + 0x10) + 0x48))(lVar3 + 0x10);
      }
      if ((local_79 & 1) != 0) {
        QStack_40 = QSize::boundedTo(&min,&local_30);
        pQVar2 = QPointer<QWidget>::operator->(&this->widget);
        iVar1 = QSize::width(&stack0xffffffffffffffc0);
        local_44 = (**(code **)(*(long *)pQVar2 + 0x80))(pQVar2,iVar1);
        iVar1 = QSize::width(&stack0xffffffffffffffc0);
        local_50 = QSize::height(&min);
        piVar4 = qMax<int>(&local_50,&local_44);
        QSize::QSize(&local_4c,iVar1,*piVar4);
        max = local_4c;
      }
      pQVar2 = QPointer<QWidget>::operator->(&this->widget);
      local_60 = QSize::expandedTo(&min,&max);
      local_58 = QSize::boundedTo(&local_60,&local_30);
      QWidget::resize((QSize *)pQVar2);
    }
    pQVar2 = QPointer<QWidget>::operator->(&this->widget);
    local_68 = QWidget::size(pQVar2);
    AbstractScrollArea::setScrolledAreaSize(this_00,&local_68);
    updateWidgetPosition(this);
  }
  return;
}

Assistant:

void
ScrollAreaPrivate::updateScrolledSize()
{
	ScrollArea * q = q_func();

	if( !widget )
		return;

	QSize p = viewport->size();

	QSize min = qSmartMinSize( widget );
	QSize max = qSmartMaxSize( widget );

	if( resizable )
	{
		if( ( widget->layout() ? widget->layout()->hasHeightForWidth() : widget->sizePolicy().hasHeightForWidth() ) )
		{
			QSize p_hfw = p.boundedTo( max );
			int h = widget->heightForWidth( p_hfw.width() );
			min = QSize( p_hfw.width(), qMax( p.height(), h ) );
		}

		widget->resize( p.expandedTo( min ).boundedTo( max ) );
	}

	q->setScrolledAreaSize( widget->size() );

	updateWidgetPosition();
}